

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * __thiscall
cfd::core::ScriptBuilder::Build(Script *__return_storage_ptr__,ScriptBuilder *this)

{
  size_t sVar1;
  CfdException *this_00;
  allocator local_51;
  ByteData data;
  undefined1 local_38 [32];
  
  ByteData::ByteData(&data,&this->script_byte_array_);
  sVar1 = ByteData::GetDataSize(&data);
  if (sVar1 < 0x2711) {
    Script::Script(__return_storage_ptr__,&data);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    return __return_storage_ptr__;
  }
  local_38._0_8_ = "cfdcore_script.cpp";
  local_38._8_4_ = 0x558;
  local_38._16_8_ = "Build";
  logger::warn<>((CfdSourceLocation *)local_38,"Script size is over.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"Script size is over.",&local_51);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Script ScriptBuilder::Build() {
  ByteData data(script_byte_array_);
  if (data.GetDataSize() > Script::kMaxScriptSize) {
    warn(CFD_LOG_SOURCE, "Script size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script size is over.");
  }

  return Script(data);
}